

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

int luaL_error(lua_State *L,char *fmt,...)

{
  lua_State *in_RCX;
  char *in_RDX;
  __va_list_tag *in_stack_00000098;
  char *in_stack_000000a0;
  lua_State *in_stack_000000a8;
  va_list argp;
  char *msg;
  
  lj_str_pushvf(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  lj_err_callermsg(in_RCX,in_RDX);
}

Assistant:

LUALIB_API int luaL_error(lua_State *L, const char *fmt, ...)
{
  const char *msg;
  va_list argp;
  va_start(argp, fmt);
  msg = lj_str_pushvf(L, fmt, argp);
  va_end(argp);
  lj_err_callermsg(L, msg);
  return 0;  /* unreachable */
}